

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::~CreateContextExtCase(CreateContextExtCase *this)

{
  CreateContextExtCase *this_local;
  
  ~CreateContextExtCase(this);
  operator_delete(this,0xe0);
  return;
}

Assistant:

CreateContextExtCase::~CreateContextExtCase (void)
{
	deinit();
}